

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

path * __thiscall boost::filesystem::path::replace_extension(path *this,path *new_extension)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  path local_38;
  path *local_18;
  path *new_extension_local;
  path *this_local;
  
  local_18 = new_extension;
  new_extension_local = this;
  lVar2 = std::__cxx11::string::size();
  extension(&local_38,this);
  lVar3 = std::__cxx11::string::size();
  std::__cxx11::string::erase((ulong)this,lVar2 - lVar3);
  ~path(&local_38);
  bVar1 = empty(local_18);
  if (!bVar1) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
    if (*pcVar4 != '.') {
      std::__cxx11::string::push_back((char)this);
    }
    std::__cxx11::string::append((string *)this);
  }
  return this;
}

Assistant:

path& path::replace_extension(const path& new_extension)
  {
    // erase existing extension, including the dot, if any
    m_pathname.erase(m_pathname.size()-extension().m_pathname.size());

    if (!new_extension.empty())
    {
      // append new_extension, adding the dot if necessary
      if (new_extension.m_pathname[0] != dot)
        m_pathname.push_back(dot);
      m_pathname.append(new_extension.m_pathname);
    }

    return *this;
  }